

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

bool __thiscall QSslSocket::waitForConnected(QSslSocket *this,int msecs)

{
  QAbstractSocketPrivate *this_00;
  _func_int **pp_Var1;
  char cVar2;
  bool bVar3;
  SocketState state;
  SocketError errorCode;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketPrivate **)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  pp_Var1 = this_00[1].super_QAbstractSocketEngineReceiver._vptr_QAbstractSocketEngineReceiver;
  if (pp_Var1 != (_func_int **)0x0) {
    cVar2 = (**(code **)(*pp_Var1 + 0x130))(pp_Var1,CONCAT44(in_register_00000034,msecs));
    bVar3 = true;
    if (cVar2 != '\0') goto LAB_0024d2f5;
    state = QAbstractSocket::state
                      ((QAbstractSocket *)
                       this_00[1].super_QAbstractSocketEngineReceiver.
                       _vptr_QAbstractSocketEngineReceiver);
    QAbstractSocket::setSocketState((QAbstractSocket *)this,state);
    errorCode = QAbstractSocket::error
                          ((QAbstractSocket *)
                           this_00[1].super_QAbstractSocketEngineReceiver.
                           _vptr_QAbstractSocketEngineReceiver);
    QIODevice::errorString();
    QAbstractSocketPrivate::setError(this_00,errorCode,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  bVar3 = false;
LAB_0024d2f5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QSslSocket::waitForConnected(int msecs)
{
    Q_D(QSslSocket);
    if (!d->plainSocket)
        return false;
    bool retVal = d->plainSocket->waitForConnected(msecs);
    if (!retVal) {
        setSocketState(d->plainSocket->state());
        d->setError(d->plainSocket->error(), d->plainSocket->errorString());
    }
    return retVal;
}